

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_safe.cpp
# Opt level: O0

void __thiscall
ot::commissioner::CommissionerSafe::Petition
          (CommissionerSafe *this,PetitionHandler *aHandler,string *aAddr,uint16_t aPort)

{
  anon_class_80_4_b999da52 local_98;
  AsyncRequest local_48;
  uint16_t local_22;
  string *psStack_20;
  uint16_t aPort_local;
  string *aAddr_local;
  PetitionHandler *aHandler_local;
  CommissionerSafe *this_local;
  
  local_98.this = this;
  local_22 = aPort;
  psStack_20 = aAddr;
  aAddr_local = (string *)aHandler;
  aHandler_local = (PetitionHandler *)this;
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_ot::commissioner::Error)>
  ::function(&local_98.aHandler,aHandler);
  std::__cxx11::string::string((string *)&local_98.aAddr,(string *)psStack_20);
  local_98.aPort = local_22;
  std::function<void()>::
  function<ot::commissioner::CommissionerSafe::Petition(std::function<void(std::__cxx11::string_const*,ot::commissioner::Error)>,std::__cxx11::string_const&,unsigned_short)::__0,void>
            ((function<void()> *)&local_48,&local_98);
  PushAsyncRequest(this,&local_48);
  std::function<void_()>::~function(&local_48);
  Petition(std::function<void(std::__cxx11::string_const*,ot::commissioner::Error)>,std::__cxx11::string_const&,unsigned_short)
  ::$_0::~__0((__0 *)&local_98);
  return;
}

Assistant:

void CommissionerSafe::Petition(PetitionHandler aHandler, const std::string &aAddr, uint16_t aPort)
{
    PushAsyncRequest([=]() { mImpl->Petition(aHandler, aAddr, aPort); });
}